

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

uint8_t * __thiscall Lodtalk::VMHeap::allocate(VMHeap *this,size_t objectSize)

{
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = objectSize + this->size;
  uVar1 = this->capacity;
  puVar3 = this->addressSpace + this->size;
  if (uVar1 < uVar5) {
    uVar4 = -this->pageSize & (uVar5 + this->pageSize) - 1;
    iVar2 = mprotect(this->addressSpace + uVar1,uVar4 - uVar1,3);
    if (iVar2 == 0) {
      this->size = uVar5;
      this->capacity = uVar4;
    }
    else {
      puVar3 = (uint8_t *)0x0;
    }
  }
  else {
    this->size = uVar5;
  }
  return puVar3;
}

Assistant:

uint8_t *VMHeap::allocate(size_t objectSize)
{
    size_t newHeapSize = size + objectSize;
    auto result = addressSpace + size;

    // Check the current capacity
    if(newHeapSize <= capacity)
    {
        size = newHeapSize;
        return result;
    }

    // Compute the new capacity
    auto newCapacity = (newHeapSize + pageSize - 1) & (~ (pageSize - 1));
    if(!allocateVirtualAddressRegion(addressSpace, capacity, newCapacity - capacity))
        return nullptr;

    // Store the new capacity and sizes
    //printf("vm heap %zu %zu\n", newHeapSize, newCapacity);
    size = newHeapSize;
    capacity = newCapacity;
    return result;
}